

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O0

bool __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateValidationTolerance
          (Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,string *tolerance)

{
  char *__nptr;
  long in_RDI;
  char *tailptr;
  double in_stack_00000040;
  cpp_dec_float<50U,_int,_void> *in_stack_00000048;
  double local_40;
  char *local_38 [4];
  double *local_18;
  long local_10;
  double *local_8;
  
  __nptr = (char *)std::__cxx11::string::c_str();
  local_40 = strtod(__nptr,local_38);
  local_10 = in_RDI + 0x28;
  local_18 = &local_40;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            (in_stack_00000048,in_stack_00000040);
  return *local_38[0] == '\0';
}

Assistant:

bool Validation<R>::updateValidationTolerance(const std::string& tolerance)
{
   char* tailptr;
   validatetolerance = strtod(tolerance.c_str(), &tailptr);

   if(*tailptr)
   {
      //conversion failed because the input wasn't a number
      return false;
   }

   return true;
}